

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void setiter(ident *id,int i,identstack *stack)

{
  tagval zero;
  anon_union_8_5_08252708_for_identval_0 local_20;
  undefined4 local_18;
  
  if (i == 0) {
    local_18 = 1;
    local_20.i = 0;
    pusharg(id,(tagval *)&local_20,stack);
    *(byte *)&id->flags = (byte)id->flags & 0xdf;
  }
  else {
    if ((id->field_2).minval != 1) {
      if (((id->field_2).minval == 3) && ((id->field_4).args != (char *)0x0)) {
        operator_delete__((id->field_4).args);
      }
      cleancode(id);
      (id->field_2).minval = 1;
    }
    *(int *)&id->field_4 = i;
  }
  return;
}

Assistant:

static inline void setiter(ident &id, int i, identstack &stack)
{
    if(i)
    {
        if(id.valtype != VAL_INT)
        {
            if(id.valtype == VAL_STR) delete[] id.val.s;
            cleancode(id);
            id.valtype = VAL_INT;
        }
        id.val.i = i;
    }
    else
    {
        tagval zero;
        zero.setint(0);
        pusharg(id, zero, stack);
        id.flags &= ~IDF_UNKNOWN;
    }
}